

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

void Abc_NtkInOutConeCounters
               (Abc_Ntk_t *pNtk,Vec_Int_t *vFan,Vec_Int_t *vFon,Vec_Int_t *vFanR,Vec_Int_t *vFonR)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Abc_Obj_t *pAVar4;
  int nFanoutsMax;
  int nFaninsMax;
  int nFanouts;
  int nFanins;
  int i;
  Vec_Int_t *vSuppsCi;
  Vec_Int_t *vSuppsCo;
  Abc_Obj_t *pNode;
  Vec_Int_t *vFonR_local;
  Vec_Int_t *vFanR_local;
  Vec_Int_t *vFon_local;
  Vec_Int_t *vFan_local;
  Abc_Ntk_t *pNtk_local;
  
  p = Abc_NtkCollectCoCones(pNtk,1);
  p_00 = Abc_NtkCollectCiCones(pNtk,1);
  iVar1 = Vec_IntFindMax(p);
  iVar2 = Vec_IntFindMax(p_00);
  Vec_IntFill(vFan,iVar1 + 1,0);
  Vec_IntFill(vFon,iVar2 + 1,0);
  Vec_IntFill(vFanR,iVar1 + 1,0);
  Vec_IntFill(vFonR,iVar2 + 1,0);
  for (nFanouts = 0; iVar1 = Abc_NtkCoNum(pNtk), nFanouts < iVar1; nFanouts = nFanouts + 1) {
    pAVar4 = Abc_NtkCo(pNtk,nFanouts);
    iVar1 = Vec_IntEntry(p,nFanouts);
    Vec_IntAddToEntry(vFan,iVar1,1);
    uVar3 = Abc_ObjId(pAVar4);
    Vec_IntWriteEntry(vFanR,iVar1,uVar3);
  }
  for (nFanouts = 0; iVar1 = Abc_NtkCiNum(pNtk), nFanouts < iVar1; nFanouts = nFanouts + 1) {
    pAVar4 = Abc_NtkCi(pNtk,nFanouts);
    iVar1 = Vec_IntEntry(p_00,nFanouts);
    Vec_IntAddToEntry(vFon,iVar1,1);
    uVar3 = Abc_ObjId(pAVar4);
    Vec_IntWriteEntry(vFonR,iVar1,uVar3);
  }
  Vec_IntFree(p);
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Abc_NtkInOutConeCounters( Abc_Ntk_t * pNtk, Vec_Int_t * vFan, Vec_Int_t * vFon, Vec_Int_t * vFanR, Vec_Int_t * vFonR )
{
    Abc_Obj_t * pNode;
    Vec_Int_t * vSuppsCo = Abc_NtkCollectCoCones( pNtk, 1 );
    Vec_Int_t * vSuppsCi = Abc_NtkCollectCiCones( pNtk, 1 );
    int i, nFanins, nFanouts;
    int nFaninsMax  = Vec_IntFindMax( vSuppsCo );
    int nFanoutsMax = Vec_IntFindMax( vSuppsCi );
    Vec_IntFill( vFan, nFaninsMax + 1, 0 );
    Vec_IntFill( vFon, nFanoutsMax + 1, 0 );
    Vec_IntFill( vFanR, nFaninsMax + 1, 0 );
    Vec_IntFill( vFonR, nFanoutsMax + 1, 0 );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        nFanins  = Vec_IntEntry( vSuppsCo, i );
        Vec_IntAddToEntry( vFan,  nFanins, 1 );
        Vec_IntWriteEntry( vFanR, nFanins, Abc_ObjId(pNode) );
    }
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        nFanouts = Vec_IntEntry( vSuppsCi, i );
        Vec_IntAddToEntry( vFon, nFanouts, 1 );
        Vec_IntWriteEntry( vFonR, nFanouts, Abc_ObjId(pNode) );
    }
    Vec_IntFree( vSuppsCo );
    Vec_IntFree( vSuppsCi );
}